

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileStream.cpp
# Opt level: O2

RefCntAutoPtr<Diligent::BasicFileStream> __thiscall
Diligent::BasicFileStream::Create(BasicFileStream *this,Char *Path,EFileAccessMode Access)

{
  BasicFileStream *pObj;
  EFileAccessMode Access_local;
  Char *Path_local;
  string msg;
  
  Access_local = Access;
  Path_local = Path;
  if ((Path == (Char *)0x0) || (*Path == '\0')) {
    FormatString<char[31]>(&msg,(char (*) [31])"Path must not be null or empty");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/BasicFileStream.cpp"
               ,0x26);
    std::__cxx11::string::~string((string *)&msg);
    (this->super_ObjectBase<Diligent::IFileStream>).super_RefCountedObject<Diligent::IFileStream>.
    super_IFileStream.super_IObject._vptr_IObject = (_func_int **)0x0;
  }
  else {
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    pObj = MakeNewRCObj<Diligent::BasicFileStream,Diligent::IMemoryAllocator>::operator()
                     (&msg,&Path_local,&Access_local);
    RefCntAutoPtr<Diligent::BasicFileStream>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)this,pObj);
  }
  return (RefCntAutoPtr<Diligent::BasicFileStream>)this;
}

Assistant:

RefCntAutoPtr<BasicFileStream> BasicFileStream::Create(const Char* Path, EFileAccessMode Access)
{
    if (Path == nullptr || Path[0] == '\0')
    {
        DEV_ERROR("Path must not be null or empty");
        return {};
    }

    return RefCntAutoPtr<BasicFileStream>{MakeNewRCObj<BasicFileStream>()(Path, Access)};
}